

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O1

void ParseCarrier(COM0R20_CB_t *cbp)

{
  byte bVar1;
  char *pcVar2;
  int i;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int *piVar6;
  int i_1;
  long lVar7;
  byte bVar8;
  uint uVar9;
  
  puts("Carrier board EEPROM");
  printf("   ");
  PrintUdid(&cbp->DevId);
  putchar(10);
  printf("   Carrier Type: %d\n",(ulong)cbp->CBType);
  printf("   Spec Revision: %d.%d\n",(ulong)(cbp->SpecRev >> 4),(ulong)(cbp->SpecRev & 0xf));
  printf("   USB Port Count: Super Speed: %d, High Speed: %d\n",(ulong)(cbp->UsbDesc >> 4 & 7),
         (ulong)(cbp->UsbDesc & 0xf));
  printf("   SAS ports: ");
  uVar3 = 1;
  uVar9 = 0;
  do {
    pcVar2 = "SATA";
    if ((cbp->SasDesc >> ((byte)uVar9 & 0x1f) & 2) != 0) {
      pcVar2 = "SAS";
    }
    if ((cbp->SasDesc >> (uVar9 & 0x1f) & 1) == 0) {
      pcVar2 = "None";
    }
    printf("%d:%s ",(ulong)uVar3,pcVar2);
    uVar3 = uVar3 + 1;
    uVar9 = uVar9 + 2;
  } while (uVar3 != 5);
  putchar(10);
  printf("   LAN: ");
  uVar3 = 0;
  do {
    if ((cbp->LanDesc >> (uVar3 & 0x1f) & 1) != 0) {
      printf("GBE%d ",(ulong)uVar3);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 3);
  putchar(10);
  printf("   Misc IO1: ");
  piVar6 = &DAT_0010501c;
  lVar7 = 0;
  do {
    if ((cbp->MiscIo1 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
      printf("%s ",(long)&DAT_0010501c + (long)*piVar6);
    }
    lVar7 = lVar7 + 1;
    piVar6 = piVar6 + 1;
  } while (lVar7 != 8);
  putchar(10);
  printf("   Misc IO2: ");
  piVar6 = &DAT_0010503c;
  lVar7 = 0;
  do {
    if ((cbp->MiscIo2 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
      printf("%s ",(long)&DAT_0010503c + (long)*piVar6);
    }
    lVar7 = lVar7 + 1;
    piVar6 = piVar6 + 1;
  } while (lVar7 != 8);
  putchar(10);
  bVar8 = 0;
  printf("   DDI: ");
  uVar3 = 0;
  do {
    uVar9 = cbp->DDIDesc[uVar3 >> 1] >> (bVar8 & 4) & 7;
    if ((byte)((char)uVar9 - 1U) < 4) {
      printf("%d:%s ",(ulong)uVar3,&DAT_0010505c + *(int *)(&DAT_0010505c + (ulong)(uVar9 - 1) * 4))
      ;
    }
    uVar3 = uVar3 + 1;
    bVar8 = bVar8 + 4;
  } while (uVar3 != 4);
  putchar(10);
  printf("   PCI Express Lane Gen:");
  bVar8 = 0;
  uVar3 = 0;
  uVar9 = 0;
  do {
    uVar5 = cbp->PCIeGen[uVar3 >> 2] >> (bVar8 & 6) & 3;
    if (uVar5 != 3) {
      if ((uVar9 & 0xf) == 0) {
        printf("\n      ");
      }
      printf("%d:Gen%d ",(ulong)uVar3,(ulong)(uVar5 + 1));
      uVar9 = uVar9 + 1;
    }
    uVar3 = uVar3 + 1;
    bVar8 = bVar8 + 2;
  } while (uVar3 != 0x20);
  putchar(10);
  bVar8 = 0;
  printf("   PCI Express Lane Map:");
  uVar3 = 0;
  uVar9 = 0;
  do {
    bVar1 = cbp->LaneMap[uVar3 >> 1] >> (bVar8 & 4);
    bVar4 = bVar1 & 7;
    if (((bVar1 & 7) != 0) && (bVar4 != 7)) {
      if ((uVar9 & 0xf) == 0) {
        printf("\n      ");
      }
      printf("%d:x%d ",(ulong)uVar3,(ulong)(uint)(1 << (bVar4 - 1 & 0x1f)));
      uVar9 = uVar9 + 1;
    }
    uVar3 = uVar3 + 1;
    bVar8 = bVar8 + 4;
  } while (uVar3 != 0x20);
  putchar(10);
  return;
}

Assistant:

void ParseCarrier(COM0R20_CB_t *cbp)
{
	const char *misc_io1_str[] = 
		{ "WAKE0", "WAKE1", "SUS", "BATLOW", "THRMP", "EBROM", "WDT", "AC97" };
 	const char *misc_io2_str[] = 
		{ "SSC", "SDIO", "LID_SW", "Sleep", "FAN0", "SER0", "SER1", "Reserved" };
	const char *ddi_port_str[] =
		{ "eDisplay Port", "Display Port", "HDMI/DVI", "SDVO" };
	int count;
    printf("Carrier board EEPROM\n");
    printf("   "); PrintUdid(&cbp->DevId); printf("\n");
    printf("   Carrier Type: %d\n", cbp->CBType);
    printf("   Spec Revision: %d.%d\n", cbp->SpecRev >> 4 & 0xF, cbp->SpecRev & 0xF);
    printf("   USB Port Count: Super Speed: %d, High Speed: %d\n",
		cbp->UsbDesc >> 4 & 7, cbp->UsbDesc & 0xF);
	printf("   SAS ports: ");
	for(int i = 0; i < 4; i++) {
		printf("%d:%s ", i + 1, 
			(cbp->SasDesc >> (i * 2) & 1) ?
				((cbp->SasDesc >> (i * 2 + 1) & 1) ? "SAS" : "SATA") : "None"); 
	}
	printf("\n");
	printf("   LAN: ");
	for(int i = 0; i < 3; i++) {
		if(cbp->LanDesc & (1 << i)) {
			printf("GBE%d ", i);
		}
	}
	printf("\n");
	printf("   Misc IO1: ");
	for(int i = 0; i < 8; i++) {
		if(cbp->MiscIo1 & (1 << i)) {
			printf("%s ", misc_io1_str[i]);
		}
	}
	printf("\n");
	printf("   Misc IO2: ");
	for(int i = 0; i < 8; i++) {
		if(cbp->MiscIo2 & (1 << i)) {
			printf("%s ", misc_io2_str[i]);
		}
	}
	printf("\n");
	printf("   DDI: ");
	for(int i = 0; i < 4; i++) {
		uint8_t ddi_desc = cbp->DDIDesc[i >> 1];
		if(i & 1)
			ddi_desc >>= 4;
		ddi_desc &= 7;
		if(ddi_desc >= 1 && ddi_desc <= 4) {
			printf("%d:%s ", i, ddi_port_str[ddi_desc - 1]);
		}
	}
	printf("\n");
	printf("   PCI Express Lane Gen:");
	count = 0;
	for(int i = 0; i < 32; i++) {
		uint8_t gen = cbp->PCIeGen[i >> 2];
		gen >>= (i & 3) << 1;
		gen &= 3;
		if(gen != 3) {
			if(count % 16 == 0) {
				printf("\n      ");
			}
			printf("%d:Gen%d ", i, gen + 1);
			count ++;
		}
	}
	printf("\n");
	printf("   PCI Express Lane Map:");
	count = 0;
	for(int i = 0; i < 32; i++) {
		uint8_t map = cbp->LaneMap[i >> 1];
		if(i & 1)
			map >>= 4;
		map &= 7;
		if(map != 0 && map != 7) {
			if(count % 16 == 0) {
				printf("\n      ");
			}
			printf("%d:x%d ", i, 1 << (map-1));
			count ++;
		}
	}
	printf("\n");
}